

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

bool glu::isSizedFormatColorRenderable
               (RenderContext *renderCtx,ContextInfo *contextInfo,deUint32 sizedFormat)

{
  bool bVar1;
  deUint32 dVar2;
  InternalError *this;
  allocator<char> local_51;
  string local_50;
  deUint32 local_2c;
  ContextType local_28;
  ApiType local_24;
  undefined4 local_20;
  deUint32 local_1c;
  deUint32 renderable;
  deUint32 sizedFormat_local;
  ContextInfo *contextInfo_local;
  RenderContext *renderCtx_local;
  
  local_20 = 0;
  local_1c = sizedFormat;
  _renderable = contextInfo;
  contextInfo_local = (ContextInfo *)renderCtx;
  local_28.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  local_24 = ContextType::getAPI(&local_28);
  local_2c = (deUint32)ApiType::es(3,0);
  bVar1 = ApiType::operator==(&local_24,(ApiType)local_2c);
  if (!bVar1) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Context type not supported in query",&local_51);
    tcu::InternalError::InternalError(this,&local_50);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  dVar2 = getRenderableBitsES3(_renderable,local_1c);
  return (dVar2 & 1) != 0;
}

Assistant:

bool isSizedFormatColorRenderable (const RenderContext& renderCtx, const ContextInfo& contextInfo, deUint32 sizedFormat)
{
	deUint32 renderable = 0;

	if (renderCtx.getType().getAPI() == ApiType::es(3,0))
		renderable = getRenderableBitsES3(contextInfo, sizedFormat);
	else
		throw tcu::InternalError("Context type not supported in query");

	return (renderable & RENDERABLE_COLOR) != 0;
}